

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void get_range(int ndim,int *dims,int *lo,int *hi)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  
  if (0 < ndim) {
    uVar7 = 0;
    do {
      iVar4 = rand();
      iVar1 = dims[uVar7];
      iVar5 = rand();
      iVar2 = dims[uVar7];
      piVar6 = lo;
      piVar3 = hi;
      if (iVar4 % iVar1 < iVar5 % iVar2) {
        piVar6 = hi;
        piVar3 = lo;
      }
      piVar3[uVar7] = iVar4 % iVar1;
      piVar6[uVar7] = iVar5 % iVar2;
      uVar7 = uVar7 + 1;
    } while ((uint)ndim != uVar7);
  }
  return;
}

Assistant:

void get_range( int ndim, int dims[], int lo[], int hi[]) 
{
    int dim;
    for(dim=0; dim <ndim;dim++){
        int toss1, toss2;
        toss1 = rand()%dims[dim];
        toss2 = rand()%dims[dim];
        if(toss1<toss2){
            lo[dim]=toss1;
            hi[dim]=toss2;
        }else {
              hi[dim]=toss1;
            lo[dim]=toss2;
        }
    }
}